

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
* __thiscall
AlignmentRecord::referenceString
          (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,AlignmentRecord *this,
          vector<char,_std::allocator<char>_> *cigarData,int startPosition,string *sequence,
          string *qualities,string *reference)

{
  pointer pcVar1;
  char *pcVar2;
  char cVar3;
  int s;
  ulong uVar4;
  int iVar5;
  string alignSeq;
  int local_c8 [8];
  string *local_a8;
  string *local_a0;
  string constructedReference;
  vector<int,_std::allocator<int>_> qualityList;
  string replaceString;
  
  local_a8 = qualities;
  std::__cxx11::string::string((string *)&constructedReference,"",(allocator *)&alignSeq);
  std::__cxx11::string::string((string *)&alignSeq,"",(allocator *)&replaceString);
  qualityList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  qualityList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  qualityList.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  computeOffset(cigarData);
  std::__cxx11::string::string((string *)&replaceString,"G",(allocator *)local_c8);
  uVar4 = 0;
  iVar5 = 0;
  local_a0 = sequence;
  do {
    pcVar1 = (cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(cigarData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar1) <= uVar4) {
      std::__cxx11::string::push_back((char)&constructedReference);
      std::locale::locale((locale *)local_c8);
      boost::algorithm::to_upper<std::__cxx11::string>(&constructedReference,(locale *)local_c8);
      std::locale::~locale((locale *)local_c8);
      std::locale::locale((locale *)local_c8);
      boost::algorithm::to_upper<std::__cxx11::string>(&alignSeq,(locale *)local_c8);
      std::locale::~locale((locale *)local_c8);
      std::
      _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
      ::
      _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,std::vector<int,std::allocator<int>>&,void>
                ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                  *)__return_storage_ptr__,&constructedReference,&alignSeq,&qualityList);
      std::__cxx11::string::~string((string *)&replaceString);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&qualityList.super__Vector_base<int,_std::allocator<int>_>);
      std::__cxx11::string::~string((string *)&alignSeq);
      std::__cxx11::string::~string((string *)&constructedReference);
      return __return_storage_ptr__;
    }
    cVar3 = (char)&alignSeq;
    switch(pcVar1[uVar4]) {
    case 'D':
      std::__cxx11::string::push_back(cVar3);
      local_c8[0] = 0;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&qualityList,local_c8);
      std::__cxx11::string::push_back((char)&constructedReference);
    default:
      goto switchD_001841cf_caseD_45;
    case 'H':
      std::__cxx11::string::push_back(cVar3);
      pcVar2 = (char *)std::__cxx11::string::at((ulong)local_a8);
      local_c8[0] = *pcVar2 + -0x21;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&qualityList,local_c8);
      std::__cxx11::string::push_back((char)&constructedReference);
      break;
    case 'I':
      std::__cxx11::string::at((ulong)sequence);
      std::__cxx11::string::push_back(cVar3);
      pcVar2 = (char *)std::__cxx11::string::at((ulong)local_a8);
      local_c8[0] = *pcVar2 + -0x21;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&qualityList,local_c8);
      std::__cxx11::string::push_back((char)&constructedReference);
      goto LAB_001847bd;
    case 'M':
      std::__cxx11::string::push_back((char)&constructedReference);
      if (((iVar5 == 0) ||
          (((pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 != 'C' &&
            (pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 != 'T')) ||
           (pcVar2 = (char *)std::__cxx11::string::at((ulong)&alignSeq), *pcVar2 == 'G')))) ||
         (pcVar2 = (char *)std::__cxx11::string::at((ulong)&constructedReference), *pcVar2 != 'G'))
      {
        std::__cxx11::string::at((ulong)sequence);
        std::__cxx11::string::push_back(cVar3);
      }
      else {
        std::__cxx11::string::substr((ulong)local_c8,(ulong)&alignSeq);
        std::__cxx11::string::operator=((string *)&alignSeq,(string *)local_c8);
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::append((char *)&alignSeq);
        sequence = local_a0;
        std::__cxx11::string::at((ulong)local_a0);
        std::__cxx11::string::push_back(cVar3);
        std::__cxx11::string::at((ulong)sequence);
        std::__cxx11::string::push_back((char)&replaceString);
        std::__cxx11::string::replace((ulong)sequence,(long)(iVar5 + -1),(string *)0x2);
        std::__cxx11::string::assign((char *)&replaceString);
      }
      pcVar2 = (char *)std::__cxx11::string::at((ulong)local_a8);
      local_c8[0] = *pcVar2 + -0x21;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&qualityList,local_c8);
      break;
    case 'N':
      std::__cxx11::string::push_back((char)&constructedReference);
      if (((iVar5 == 0) ||
          ((pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 != 'C' &&
           (pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 != 'T')))) ||
         ((pcVar2 = (char *)std::__cxx11::string::at((ulong)&alignSeq), *pcVar2 == 'G' ||
          (pcVar2 = (char *)std::__cxx11::string::at((ulong)&constructedReference), *pcVar2 != 'G'))
         )) {
        std::__cxx11::string::at((ulong)sequence);
        std::__cxx11::string::push_back(cVar3);
      }
      else {
        std::__cxx11::string::substr((ulong)local_c8,(ulong)&alignSeq);
        std::__cxx11::string::operator=((string *)&alignSeq,(string *)local_c8);
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::append((char *)&alignSeq);
        sequence = local_a0;
        std::__cxx11::string::at((ulong)local_a0);
        std::__cxx11::string::push_back(cVar3);
        std::__cxx11::string::at((ulong)sequence);
        std::__cxx11::string::push_back((char)&replaceString);
        std::__cxx11::string::replace((ulong)sequence,(long)(iVar5 + -1),(string *)0x2);
        std::__cxx11::string::assign((char *)&replaceString);
      }
      pcVar2 = (char *)std::__cxx11::string::at((ulong)local_a8);
      local_c8[0] = *pcVar2 + -0x21;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&qualityList,local_c8);
      break;
    case 'P':
      std::__cxx11::string::push_back((char)&constructedReference);
      if (((iVar5 == 0) ||
          ((pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 != 'C' &&
           (pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 != 'T')))) ||
         ((pcVar2 = (char *)std::__cxx11::string::at((ulong)&alignSeq), *pcVar2 == 'G' ||
          (pcVar2 = (char *)std::__cxx11::string::at((ulong)&constructedReference), *pcVar2 != 'G'))
         )) {
        std::__cxx11::string::at((ulong)sequence);
        std::__cxx11::string::push_back(cVar3);
      }
      else {
        std::__cxx11::string::substr((ulong)local_c8,(ulong)&alignSeq);
        std::__cxx11::string::operator=((string *)&alignSeq,(string *)local_c8);
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::append((char *)&alignSeq);
        sequence = local_a0;
        std::__cxx11::string::at((ulong)local_a0);
        std::__cxx11::string::push_back(cVar3);
        std::__cxx11::string::at((ulong)sequence);
        std::__cxx11::string::push_back((char)&replaceString);
        std::__cxx11::string::replace((ulong)sequence,(long)(iVar5 + -1),(string *)0x2);
        std::__cxx11::string::assign((char *)&replaceString);
      }
      pcVar2 = (char *)std::__cxx11::string::at((ulong)local_a8);
      local_c8[0] = *pcVar2 + -0x21;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&qualityList,local_c8);
      break;
    case 'S':
      std::__cxx11::string::push_back((char)&constructedReference);
      if (((iVar5 == 0) ||
          (((pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 != 'C' &&
            (pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 != 'T')) ||
           (pcVar2 = (char *)std::__cxx11::string::at((ulong)&alignSeq), *pcVar2 == 'G')))) ||
         (pcVar2 = (char *)std::__cxx11::string::at((ulong)&constructedReference), *pcVar2 != 'G'))
      {
        std::__cxx11::string::at((ulong)sequence);
        std::__cxx11::string::push_back(cVar3);
      }
      else {
        std::__cxx11::string::substr((ulong)local_c8,(ulong)&alignSeq);
        std::__cxx11::string::operator=((string *)&alignSeq,(string *)local_c8);
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::append((char *)&alignSeq);
        sequence = local_a0;
        std::__cxx11::string::at((ulong)local_a0);
        std::__cxx11::string::push_back(cVar3);
        std::__cxx11::string::at((ulong)sequence);
        std::__cxx11::string::push_back((char)&replaceString);
        std::__cxx11::string::replace((ulong)sequence,(long)(iVar5 + -1),(string *)0x2);
        std::__cxx11::string::assign((char *)&replaceString);
      }
      pcVar2 = (char *)std::__cxx11::string::at((ulong)local_a8);
      local_c8[0] = *pcVar2 + -0x21;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&qualityList,local_c8);
LAB_001847bd:
      iVar5 = iVar5 + 1;
      goto switchD_001841cf_caseD_45;
    }
    iVar5 = iVar5 + 1;
switchD_001841cf_caseD_45:
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

std::tuple<string,string,vector<int>> AlignmentRecord::referenceString(const std::vector<char> cigarData, int startPosition, std::string& sequence, string  qualities, string & reference){

    string constructedReference = "";
    string alignSeq="";
    vector<int> qualityList;
    int referenceCounter = startPosition-computeOffset(cigarData);
    int sequenceCounter=0;//this is the quality counter as well
    string replaceString = "G";

    for ( int s = 0; s < cigarData.size(); s++) {
        if (cigarData[s] == 'I') {
            alignSeq+=sequence.at(sequenceCounter);
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            constructedReference +='I';
        }else if (cigarData[s] == 'D'){
            alignSeq+='D';
            qualityList.push_back(0);
            constructedReference += (reference)[referenceCounter];
            referenceCounter++;
        }else if (cigarData[s] == 'S'){
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            referenceCounter++;
            sequenceCounter++;
        }else if (cigarData[s] == 'H'){
            alignSeq+='H';
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            constructedReference += 'H';
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'M') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'N') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'P') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else {
            assert(false);
        }
    }
    constructedReference+=reference[referenceCounter];


    if(cigarData.size()!=constructedReference.size()-1){
        assert(false);
    }
    boost::algorithm::to_upper(constructedReference);
    boost::algorithm::to_upper(alignSeq);
    return std::make_tuple(constructedReference,alignSeq,qualityList);

}